

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

void my_progress_monitor(j_common_ptr dinfo)

{
  long lVar1;
  long lVar2;
  long *in_RDI;
  long *in_FS_OFFSET;
  int scan_no;
  my_progress_ptr myprog;
  my_error_ptr myerr;
  
  lVar1 = *in_RDI;
  lVar2 = in_RDI[2];
  if (((int)in_RDI[4] != 0) && (500 < *(int *)((long)in_RDI + 0xac))) {
    snprintf((char *)(*(long *)(lVar2 + 0x20) + 0x608),200,
             "Progressive JPEG image has more than 500 scans");
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"Progressive JPEG image has more than 500 scans");
    *(undefined4 *)(*(long *)(lVar2 + 0x20) + 0x6d0) = 1;
    *(undefined4 *)(lVar1 + 0x178) = 0;
    longjmp((__jmp_buf_tag *)(lVar1 + 0xa8),1);
  }
  return;
}

Assistant:

static void my_progress_monitor(j_common_ptr dinfo)
{
  my_error_ptr myerr = (my_error_ptr)dinfo->err;
  my_progress_ptr myprog = (my_progress_ptr)dinfo->progress;

  if (dinfo->is_decompressor) {
    int scan_no = ((j_decompress_ptr)dinfo)->input_scan_number;

    if (scan_no > 500) {
      snprintf(myprog->this->errStr, JMSG_LENGTH_MAX,
               "Progressive JPEG image has more than 500 scans");
      snprintf(errStr, JMSG_LENGTH_MAX,
               "Progressive JPEG image has more than 500 scans");
      myprog->this->isInstanceError = TRUE;
      myerr->warning = FALSE;
      longjmp(myerr->setjmp_buffer, 1);
    }
  }
}